

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

int luaO_int2fb(uint x)

{
  uint uVar1;
  
  if (7 < x) {
    uVar1 = 8;
    for (; 0x7f < x; x = x + 0xf >> 4) {
      uVar1 = uVar1 + 0x20;
    }
    for (; 0xf < x; x = x + 1 >> 1) {
      uVar1 = uVar1 + 8;
    }
    x = x - 8 | uVar1;
  }
  return x;
}

Assistant:

int luaO_int2fb (unsigned int x) {
  int e = 0;  /* exponent */
  if (x < 8) return x;
  while (x >= (8 << 4)) {  /* coarse steps */
    x = (x + 0xf) >> 4;  /* x = ceil(x / 16) */
    e += 4;
  }
  while (x >= (8 << 1)) {  /* fine steps */
    x = (x + 1) >> 1;  /* x = ceil(x / 2) */
    e++;
  }
  return ((e+1) << 3) | (cast_int(x) - 8);
}